

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_detect.c
# Opt level: O3

_Bool av1_compute_corner_list
                (YV12_BUFFER_CONFIG *frame,int bit_depth,int downsample_level,CornerList *corners)

{
  ImagePyramid *pyr;
  PyramidLayer *pPVar1;
  int bucket;
  int iVar2;
  uint uVar3;
  xy *__ptr;
  long lVar4;
  byte bVar5;
  int i;
  long lVar6;
  bool bVar7;
  _Bool _Var8;
  int *scores;
  int num_corners;
  int *local_448;
  uint local_43c;
  int local_438 [258];
  
  pthread_mutex_lock((pthread_mutex_t *)corners);
  _Var8 = true;
  if (corners->valid == false) {
    pyr = frame->y_pyramid;
    iVar2 = aom_compute_pyramid(frame,bit_depth,downsample_level + 1,pyr);
    if (iVar2 < 0) {
      _Var8 = false;
    }
    else {
      iVar2 = iVar2 + -1;
      pPVar1 = pyr->layers;
      local_448 = (int *)0x0;
      __ptr = aom_fast9_detect_nonmax
                        (pPVar1[iVar2].buffer,pPVar1[iVar2].width,pPVar1[iVar2].height,
                         pPVar1[iVar2].stride,0x12,&local_448,(int *)&local_43c);
      lVar6 = (long)(int)local_43c;
      if (-1 < lVar6) {
        bVar5 = (byte)iVar2;
        if (local_43c < 0x1001) {
          if (local_43c != 0) {
            lVar4 = 0;
            do {
              corners->corners[lVar4 * 2] = __ptr[lVar4].x << (bVar5 & 0x1f);
              corners->corners[lVar4 * 2 + 1] = __ptr[lVar4].y << (bVar5 & 0x1f);
              lVar4 = lVar4 + 1;
            } while (lVar6 != lVar4);
          }
          corners->num_corners = local_43c;
        }
        else {
          lVar4 = 0;
          memset(local_438,0,0x400);
          do {
            local_438[local_448[lVar4]] = local_438[local_448[lVar4]] + 1;
            lVar4 = lVar4 + 1;
          } while (lVar6 != lVar4);
          iVar2 = 0;
          uVar3 = 0xff;
          do {
            iVar2 = iVar2 + local_438[uVar3];
            if (0x1000 < iVar2) goto LAB_002a1dda;
            bVar7 = uVar3 != 0;
            uVar3 = uVar3 - 1;
          } while (bVar7);
          uVar3 = 0xffffffff;
LAB_002a1dda:
          lVar4 = 0;
          iVar2 = 0;
          do {
            if ((int)uVar3 < local_448[lVar4]) {
              corners->corners[iVar2 * 2] = __ptr[lVar4].x << (bVar5 & 0x1f);
              corners->corners[iVar2 * 2 + 1] = __ptr[lVar4].y << (bVar5 & 0x1f);
              iVar2 = iVar2 + 1;
            }
            lVar4 = lVar4 + 1;
          } while (lVar6 != lVar4);
          corners->num_corners = iVar2;
        }
        free(local_448);
        free(__ptr);
      }
      _Var8 = -1 < (int)local_43c;
    }
    corners->valid = _Var8;
  }
  pthread_mutex_unlock((pthread_mutex_t *)corners);
  return _Var8;
}

Assistant:

bool av1_compute_corner_list(const YV12_BUFFER_CONFIG *frame, int bit_depth,
                             int downsample_level, CornerList *corners) {
  assert(corners);

#if CONFIG_MULTITHREAD
  pthread_mutex_lock(&corners->mutex);
#endif  // CONFIG_MULTITHREAD

  if (!corners->valid) {
    corners->valid =
        compute_corner_list(frame, bit_depth, downsample_level, corners);
  }
  bool valid = corners->valid;

#if CONFIG_MULTITHREAD
  pthread_mutex_unlock(&corners->mutex);
#endif  // CONFIG_MULTITHREAD
  return valid;
}